

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::ToPrimSpec(MtlxModel *model,PrimSpec *ps,string *err)

{
  string *__lhs;
  bool bVar1;
  mapped_type *this;
  _Base_ptr p_Var2;
  ostream *poVar3;
  char *str;
  PrimSpec shaders;
  PrimSpec materials;
  PrimSpec root;
  allocator local_10e9;
  PrimSpec *local_10e8;
  undefined1 local_10e0 [1384];
  Property local_b78;
  PrimSpec local_598;
  
  __lhs = &model->shader_name;
  bVar1 = ::std::operator==(__lhs,"UsdPreviewSurface");
  if (bVar1) {
    str = "UsdPreviewSurface";
  }
  else {
    bVar1 = ::std::operator==(__lhs,"AutodeskStandardSurface");
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_b78);
      poVar3 = ::std::operator<<((ostream *)&local_b78,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ToPrimSpec");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3bc);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)&local_b78,"Unsupported shader_name: ");
      poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
      ::std::operator<<(poVar3,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_b78);
      return false;
    }
    str = "AutodeskStandardSurface";
  }
  Token::Token((Token *)local_10e0,str);
  detail::MakeProperty<tinyusdz::Token>(&local_b78,(Token *)local_10e0);
  local_10e8 = ps;
  ::std::__cxx11::string::string((string *)&local_598,"info:id",&local_10e9);
  this = ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
         ::operator[](&ps->_props,(key_type *)&local_598);
  Property::operator=(this,&local_b78);
  ::std::__cxx11::string::_M_dispose();
  Property::~Property(&local_b78);
  ::std::__cxx11::string::_M_dispose();
  PrimSpec::PrimSpec((PrimSpec *)&local_b78);
  ::std::__cxx11::string::assign((char *)&local_b78._attrib._type_name);
  local_b78._attrib._name._M_dataplus._M_p._0_4_ = 0;
  for (p_Var2 = (model->surface_materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(model->surface_materials)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    PrimSpec::PrimSpec((PrimSpec *)local_10e0);
    local_10e0._0_4_ = Def;
    ::std::__cxx11::string::assign(local_10e0 + 8);
    ::std::__cxx11::string::_M_assign((string *)(local_10e0 + 0x28));
    PrimSpec::~PrimSpec((PrimSpec *)local_10e0);
  }
  PrimSpec::PrimSpec((PrimSpec *)local_10e0);
  ::std::__cxx11::string::assign(local_10e0 + 0x28);
  local_10e0._0_4_ = Def;
  PrimSpec::PrimSpec(&local_598);
  ::std::__cxx11::string::assign((char *)&local_598._name);
  local_598._specifier = Def;
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
            (&local_598._children,(value_type *)&local_b78);
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
            (&local_598._children,(PrimSpec *)local_10e0);
  PrimSpec::operator=(local_10e8,&local_598);
  PrimSpec::~PrimSpec(&local_598);
  PrimSpec::~PrimSpec((PrimSpec *)local_10e0);
  PrimSpec::~PrimSpec((PrimSpec *)&local_b78);
  return true;
}

Assistant:

bool ToPrimSpec(const MtlxModel &model, PrimSpec &ps, std::string *err) {
  //
  // def "MaterialX" {
  //
  //   def "Materials" {
  //     def Material ... {
  //     }
  //   }
  //   def "Shaders" {
  //   }
  constexpr auto kAutodeskStandardSurface = "AutodeskStandardSurface";

  if (model.shader_name == kUsdPreviewSurface) {
    ps.props()["info:id"] =
        detail::MakeProperty(value::token(kUsdPreviewSurface));
  } else if (model.shader_name == kAutodeskStandardSurface) {
    ps.props()["info:id"] =
        detail::MakeProperty(value::token(kAutodeskStandardSurface));
  } else {
    PUSH_ERROR_AND_RETURN("Unsupported shader_name: " << model.shader_name);
  }

  PrimSpec materials;
  materials.name() = "Materials";
  materials.specifier() = Specifier::Def;

  for (const auto &item : model.surface_materials) {
    PrimSpec material;
    material.specifier() = Specifier::Def;
    material.typeName() = "Material";

    material.name() = item.second.name;
  }

  PrimSpec shaders;
  shaders.name() = "Shaders";
  shaders.specifier() = Specifier::Def;

  PrimSpec root;
  root.name() = "MaterialX";
  root.specifier() = Specifier::Def;

  root.children().push_back(materials);
  root.children().push_back(shaders);

  ps = std::move(root);

  return true;
}